

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O1

int flush_header(FILE *output_file_ptr)

{
  byte_t bVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  first_byte_union first_byte;
  byte local_19;
  
  bVar1 = first_byte_written;
  local_19 = first_byte_written;
  iVar2 = get_available_bits((long)out_bit_idx);
  local_19 = bVar1 & 0x1f | (char)iVar2 << 5;
  fputc((uint)local_19,(FILE *)output_file_ptr);
  iVar2 = fseek((FILE *)output_file_ptr,0,0);
  if (iVar2 == 0) {
    sVar3 = fwrite(&local_19,1,1,(FILE *)output_file_ptr);
    if (sVar3 != 0) {
      return 0;
    }
    __s = "failed to overwrite first byte";
  }
  else {
    __s = "error moving file ptr to beginning";
  }
  perror(__s);
  return 1;
}

Assistant:

int flush_header(FILE* output_file_ptr) {
#ifdef _DEBUG
    log_trace("flush_header", "old_bits=");
    log_trace_char_bin(first_byte_written);
#endif

    first_byte_union first_byte;
    first_byte.raw = first_byte_written;
    first_byte.split.header = (byte_t)get_available_bits(out_bit_idx);

#ifdef _DEBUG
    log_trace("flush_header", "new_bits=");
    log_trace_char_bin(first_byte.raw);
#endif

    fputc(first_byte.raw, output_file_ptr);

    if ( fseek(output_file_ptr, 0L, SEEK_SET) != 0 ) {
        perror("error moving file ptr to beginning");
        return RC_FAIL;
    }

    size_t bytesWritten = fwrite(&first_byte.raw, sizeof(byte_t), 1, output_file_ptr);
    if(bytesWritten == 0) {
        perror("failed to overwrite first byte");
        return RC_FAIL;
    }

    return RC_OK;
}